

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.c
# Opt level: O3

void golf_audio_update(float dt)

{
  size_t size;
  wchar_t num_frames;
  wchar_t wVar1;
  float *frames;
  float *mem;
  char *key;
  _sound_t *p_Var2;
  int j;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  map_iter_t mVar7;
  float *buffer2;
  map_iter_t iter;
  float *local_48;
  map_iter_t local_40;
  
  num_frames = saudio_expect();
  if (L'\0' < num_frames) {
    size = (ulong)(uint)num_frames * 4;
    frames = (float *)golf_alloc_tracked(size,
                                         "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/audio.c"
                                        );
    mem = (float *)golf_alloc_tracked(size,
                                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/audio.c"
                                     );
    local_48 = mem;
    memset(frames,0,size);
    mVar7 = map_iter_();
    local_40.node = mVar7.node;
    local_40.bucketidx = mVar7.bucketidx;
    key = map_next_(&_sounds.base,&local_40);
    while (key != (char *)0x0) {
      p_Var2 = (_sound_t *)map_get_(&_sounds.base,key);
      _sounds.ref = p_Var2;
      if (p_Var2->on == true) {
        fVar5 = 1.0;
        if (p_Var2->stopping == true) {
          fVar4 = p_Var2->stopping_t + dt;
          p_Var2->stopping_t = fVar4;
          fVar5 = p_Var2->stopping_length;
          if (fVar5 < fVar4) {
            p_Var2->stopping_t = fVar5;
            p_Var2->on = false;
            p_Var2->stopping = false;
            fVar4 = fVar5;
          }
          fVar5 = 1.0 - fVar4 / fVar5;
        }
        stb_vorbis_seek(p_Var2->stream,p_Var2->cur_pos);
        wVar1 = stb_vorbis_get_samples_float(p_Var2->stream,1,&local_48,num_frames);
        if (wVar1 < num_frames) {
          memset(mem + wVar1,0,(ulong)(uint)(~wVar1 + num_frames) * 4 + 4);
        }
        uVar3 = 0;
        do {
          fVar4 = p_Var2->volume * fVar5 * mem[uVar3];
          fVar6 = frames[uVar3] + fVar4;
          frames[uVar3] =
               fVar6 - fVar4 * frames[uVar3] * *(float *)(&DAT_001fe388 + (ulong)(0.0 < fVar6) * 4);
          uVar3 = uVar3 + 1;
        } while ((uint)num_frames != uVar3);
        if (wVar1 == L'\0') {
          if (p_Var2->repeat == true) {
            p_Var2->cur_pos = 0;
          }
          else {
            p_Var2->on = false;
          }
        }
        p_Var2->cur_pos = p_Var2->cur_pos + wVar1;
      }
      key = map_next_(&_sounds.base,&local_40);
    }
    saudio_push(frames,num_frames);
    golf_free_tracked(mem);
    golf_free_tracked(frames);
  }
  return;
}

Assistant:

void golf_audio_update(float dt) {
    int num_samples = saudio_expect();
    if (num_samples <= 0) {
        return;
    }

    float *buffer = golf_alloc(sizeof(float) * num_samples);
    float *buffer2 = golf_alloc(sizeof(float) * num_samples);
    for (int i = 0; i < num_samples; i++) {
        buffer[i] = 0;
    }

    const char *key;
    map_iter_t iter = map_iter(&m);
    while ((key = map_next(&_sounds, &iter))) {
        _sound_t *s = map_get(&_sounds, key);
        float scale = 1;
        if (!s->on) continue;
        if (s->stopping) {
            s->stopping_t += dt;
            if (s->stopping_t > s->stopping_length) {
                s->stopping_t = s->stopping_length;
                s->stopping = false;
                s->on = false;
            }
            scale = 1 - s->stopping_t / s->stopping_length;
        }

        stb_vorbis_seek(s->stream, s->cur_pos);
        int n = stb_vorbis_get_samples_float(s->stream, 1, &buffer2, num_samples);
        for (int j = n; j < num_samples; j++) {
            buffer2[j] = 0;
        }
        for (int j = 0; j < num_samples; j++) {
            float a = buffer[j];
            float b = s->volume * scale * buffer2[j];
            float sign = (float) ((a + b) > 0 ? 1 : -1);
            buffer[j] = a + b - a * b * sign;
        }
        if (n == 0) {
            if (s->repeat) {
                s->cur_pos = 0;
            }
            else {
                s->on = false;
            }
        }
        s->cur_pos += n;
    }

    saudio_push(buffer, num_samples);
    golf_free(buffer2);
    golf_free(buffer);
}